

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

void sysbvm_namespace_setNewSymbolBindingWithValue
               (sysbvm_context_t *context,sysbvm_tuple_t nspace,sysbvm_tuple_t symbol,
               sysbvm_tuple_t value)

{
  _Bool _Var1;
  sysbvm_tuple_t binding;
  sysbvm_tuple_t tuple;
  
  if (nspace == 0 || (nspace & 0xf) != 0) {
    sysbvm_error("Expected a namespace.");
  }
  binding = sysbvm_symbolValueBinding_create(context,0,symbol,value);
  tuple = nspace;
  sysbvm_environment_setNewBinding(context,nspace,binding);
  _Var1 = sysbvm_tuple_isFunction((sysbvm_context_t *)value,tuple);
  if (_Var1) {
    sysbvm_function_recordBindingWithOwnerAndName(context,value,nspace,symbol);
    return;
  }
  sysbvm_programEntity_recordBindingWithOwnerAndName(context,value,nspace,symbol);
  return;
}

Assistant:

SYSBVM_API void sysbvm_namespace_setNewSymbolBindingWithValue(sysbvm_context_t *context, sysbvm_tuple_t nspace, sysbvm_tuple_t symbol, sysbvm_tuple_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(nspace))
        sysbvm_error("Expected a namespace.");

    sysbvm_tuple_t binding = sysbvm_symbolValueBinding_create(context, SYSBVM_NULL_TUPLE, symbol, value);
    sysbvm_environment_setNewBinding(context, nspace, binding);

    if(sysbvm_tuple_isFunction(context, value))
        sysbvm_function_recordBindingWithOwnerAndName(context, value, nspace, symbol);
    else
        sysbvm_programEntity_recordBindingWithOwnerAndName(context, value, nspace, symbol);
}